

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int hashFunction(string *word)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  if (word->_M_string_length == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    iVar2 = 0;
    do {
      cVar1 = (word->_M_dataplus)._M_p[uVar4];
      dVar5 = exp2((double)uVar3);
      iVar2 = (int)(dVar5 * (double)(int)cVar1 + (double)iVar2);
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 2;
    } while (uVar4 < word->_M_string_length);
  }
  return iVar2;
}

Assistant:

int hashFunction(string word) {
    int result = 0;
    for (int i = 0; i < word.size(); ++i) {
        result += word[i] * pow(4, i);
    }
    return result;
}